

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  int iVar1;
  SQInteger SVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  undefined8 *in_RCX;
  long *in_RDX;
  long in_RSI;
  HSQUIRRELVM in_RDI;
  int len;
  SQChar *prec;
  SQChar f;
  SQInteger fpos;
  size_t flen;
  SQFloat tf;
  SQInteger ti;
  SQChar *ts;
  SQInteger valtype;
  SQInteger addlen;
  SQInteger w;
  SQInteger nparam;
  SQInteger i;
  SQInteger n;
  SQInteger allocated;
  SQInteger format_size;
  SQRESULT res;
  SQChar fmt [20];
  SQChar *dest;
  SQChar *format;
  SQChar **in_stack_ffffffffffffff08;
  HSQUIRRELVM in_stack_ffffffffffffff10;
  HSQUIRRELVM in_stack_ffffffffffffff18;
  HSQUIRRELVM v_00;
  undefined4 in_stack_ffffffffffffff20;
  int in_stack_ffffffffffffff24;
  HSQUIRRELVM in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  char in_stack_ffffffffffffff37;
  SQChar *in_stack_ffffffffffffff38;
  SQChar *pSVar6;
  SQChar *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  SQChar **local_a0;
  long local_98;
  HSQUIRRELVM local_88;
  long local_80;
  long local_78;
  size_t local_70;
  undefined8 local_60;
  char local_58;
  SQChar aSStack_57 [31];
  SQChar *local_38;
  long local_30;
  undefined8 *local_28;
  long *local_20;
  long local_18;
  HSQUIRRELVM local_10;
  SQRESULT local_8;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_60 = sq_getstring(in_stack_ffffffffffffff18,(SQInteger)in_stack_ffffffffffffff10,
                          in_stack_ffffffffffffff08);
  local_8 = local_60;
  if (-1 < local_60) {
    SVar2 = sq_getsize(in_stack_ffffffffffffff18,(SQInteger)in_stack_ffffffffffffff10);
    local_70 = SVar2 + 2;
    local_38 = sq_getscratchpad(in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08);
    local_78 = 0;
    local_80 = 0;
    local_88 = (HSQUIRRELVM)(local_18 + 1);
    while (local_78 < SVar2) {
      if (*(char *)(local_30 + local_78) == '%') {
        if (*(char *)(local_30 + 1 + local_78) == '%') {
          local_38[local_80] = '%';
          local_78 = local_78 + 2;
          local_80 = local_80 + 1;
        }
        else {
          v_00 = local_88;
          SVar3 = sq_gettop(local_10);
          if (SVar3 < (long)v_00) {
            SVar4 = sq_throwerror(in_stack_ffffffffffffff10,(SQChar *)in_stack_ffffffffffffff08);
            return SVar4;
          }
          SVar3 = validate_format((HSQUIRRELVM)
                                  CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                                  in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                                  CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                                  (SQInteger *)in_stack_ffffffffffffff28);
          if (SVar3 < 0) {
            return -1;
          }
          in_stack_ffffffffffffff4c = 0.0;
          in_stack_ffffffffffffff10 = (HSQUIRRELVM)(ulong)((int)*(char *)(local_30 + SVar3) - 0x45);
          switch(in_stack_ffffffffffffff10) {
          case (HSQUIRRELVM)0x0:
          case (HSQUIRRELVM)0x2:
          case (HSQUIRRELVM)0x20:
          case (HSQUIRRELVM)0x21:
          case (HSQUIRRELVM)0x22:
            SVar4 = sq_getfloat(in_stack_ffffffffffffff28,
                                CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                (SQFloat *)v_00);
            if (SVar4 < 0) {
              SVar4 = sq_throwerror(in_stack_ffffffffffffff10,(SQChar *)in_stack_ffffffffffffff08);
              return SVar4;
            }
            local_98 = 0x65;
            local_a0 = (SQChar **)0x66;
            break;
          default:
            SVar4 = sq_throwerror(in_stack_ffffffffffffff10,(SQChar *)in_stack_ffffffffffffff08);
            return SVar4;
          case (HSQUIRRELVM)0x13:
          case (HSQUIRRELVM)0x1f:
          case (HSQUIRRELVM)0x24:
          case (HSQUIRRELVM)0x2a:
          case (HSQUIRRELVM)0x30:
          case (HSQUIRRELVM)0x33:
            in_stack_ffffffffffffff40 = (SQChar *)strlen(&local_58);
            in_stack_ffffffffffffff37 = (&local_58)[(long)(in_stack_ffffffffffffff40 + -1)];
            in_stack_ffffffffffffff28 = (HSQUIRRELVM)0x1e9445;
            pSVar6 = in_stack_ffffffffffffff40 + -1;
            while (*(char *)&(in_stack_ffffffffffffff28->super_SQCollectable).super_SQRefCounted.
                             _vptr_SQRefCounted != '\0') {
              (&local_58)[(long)pSVar6] =
                   *(char *)&(in_stack_ffffffffffffff28->super_SQCollectable).super_SQRefCounted.
                             _vptr_SQRefCounted;
              in_stack_ffffffffffffff28 =
                   (HSQUIRRELVM)
                   ((long)&(in_stack_ffffffffffffff28->super_SQCollectable).super_SQRefCounted.
                           _vptr_SQRefCounted + 1);
              pSVar6 = pSVar6 + 1;
            }
            (&local_58)[(long)pSVar6] = in_stack_ffffffffffffff37;
            in_stack_ffffffffffffff38 = pSVar6 + 2;
            (pSVar6 + -0x57)[(long)&stack0x00000000] = '\0';
          case (HSQUIRRELVM)0x1e:
            SVar4 = sq_getinteger(in_stack_ffffffffffffff28,
                                  CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
                                  (SQInteger *)v_00);
            if (SVar4 < 0) {
              SVar4 = sq_throwerror(in_stack_ffffffffffffff10,(SQChar *)in_stack_ffffffffffffff08);
              return SVar4;
            }
            local_98 = 0x65;
            local_a0 = (SQChar **)0x69;
            break;
          case (HSQUIRRELVM)0x2e:
            SVar4 = sq_getstring(v_00,(SQInteger)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08
                                );
            if (SVar4 < 0) {
              SVar4 = sq_throwerror(in_stack_ffffffffffffff10,(SQChar *)in_stack_ffffffffffffff08);
              return SVar4;
            }
            SVar5 = sq_getsize(v_00,(SQInteger)in_stack_ffffffffffffff10);
            local_98 = SVar5 + 1;
            local_a0 = (SQChar **)0x73;
          }
          local_78 = SVar3 + 1;
          local_70 = local_98 + 1 + local_70;
          local_38 = sq_getscratchpad(in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08
                                     );
          if (local_a0 == (SQChar **)0x66) {
            for (in_stack_ffffffffffffff24 =
                      snprintf(local_38 + local_80,local_70,&local_58,
                               (double)in_stack_ffffffffffffff4c); 0 < in_stack_ffffffffffffff24;
                in_stack_ffffffffffffff24 = in_stack_ffffffffffffff24 + -1) {
              if (local_38[local_80] == ',') {
                local_38[local_80] = '.';
              }
              local_80 = local_80 + 1;
            }
          }
          else if (local_a0 == (SQChar **)0x69) {
            iVar1 = snprintf(local_38 + local_80,local_70,&local_58,0);
            local_80 = iVar1 + local_80;
          }
          else if (local_a0 == (SQChar **)0x73) {
            iVar1 = snprintf(local_38 + local_80,local_70,&local_58,0);
            local_80 = iVar1 + local_80;
          }
          local_88 = (HSQUIRRELVM)
                     ((long)&(local_88->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted +
                     1);
          in_stack_ffffffffffffff08 = local_a0;
        }
      }
      else {
        local_38[local_80] = *(SQChar *)(local_30 + local_78);
        local_78 = local_78 + 1;
        local_80 = local_80 + 1;
      }
    }
    *local_20 = local_80;
    local_38[local_80] = '\0';
    *local_28 = local_38;
    local_8 = 0;
  }
  return local_8;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = strlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': {
                int len = scsprintf(&dest[i], allocated, fmt, tf);
                for (; len > 0; len--, i++)
                    if (dest[i] == ',')
                        dest[i] = '.';
                break;
                }
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}